

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_valued_fast_fourier_transform.cc
# Opt level: O2

void __thiscall
sptk::RealValuedFastFourierTransform::RealValuedFastFourierTransform
          (RealValuedFastFourierTransform *this,int num_order,int fft_length)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  double dVar4;
  
  this->_vptr_RealValuedFastFourierTransform =
       (_func_int **)&PTR__RealValuedFastFourierTransform_00112c10;
  this->num_order_ = num_order;
  this->fft_length_ = fft_length;
  this->half_fft_length_ = fft_length / 2;
  FastFourierTransform::FastFourierTransform(&this->fast_fourier_transform_,fft_length / 2);
  this->is_valid_ = true;
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((-1 < this->num_order_) && (this->num_order_ < this->fft_length_)) {
    bVar2 = IsPowerOfTwo(this->fft_length_);
    if ((bVar2) && ((this->fast_fourier_transform_).is_valid_ != false)) {
      iVar1 = this->fft_length_;
      std::vector<double,_std::allocator<double>_>::resize
                (&this->sine_table_,(long)(iVar1 / -4 + iVar1 + 1));
      for (lVar3 = 0; lVar3 <= iVar1 / -4 + iVar1; lVar3 = lVar3 + 1) {
        dVar4 = sin((double)(int)lVar3 *
                    (3.141592653589793 / (double)iVar1 + 3.141592653589793 / (double)iVar1));
        (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar3] = dVar4;
      }
      (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[this->fft_length_ / 2] = 0.0;
      return;
    }
  }
  this->is_valid_ = false;
  return;
}

Assistant:

RealValuedFastFourierTransform::RealValuedFastFourierTransform(int num_order,
                                                               int fft_length)
    : num_order_(num_order),
      fft_length_(fft_length),
      half_fft_length_(fft_length_ / 2),
      fast_fourier_transform_(half_fft_length_),
      is_valid_(true) {
  if (num_order_ < 0 || fft_length_ <= num_order_ ||
      !sptk::IsPowerOfTwo(fft_length_) || !fast_fourier_transform_.IsValid()) {
    is_valid_ = false;
    return;
  }

  const int table_size(fft_length_ - fft_length_ / 4 + 1);
  const double argument(sptk::kPi / fft_length_ * 2);
  sine_table_.resize(table_size);
  for (int i(0); i < table_size; ++i) {
    sine_table_[i] = std::sin(argument * i);
  }
  sine_table_[fft_length_ / 2] = 0.0;
}